

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_PiecewiseLinearExprPrecedence_Test::ExprWriterTest_PiecewiseLinearExprPrecedence_Test
          (ExprWriterTest_PiecewiseLinearExprPrecedence_Test *this)

{
  ExprWriterTest::ExprWriterTest(&this->super_ExprWriterTest);
  (this->super_ExprWriterTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprWriterTest_0016c6d8;
  (this->super_ExprWriterTest).super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ExprWriterTest_PiecewiseLinearExprPrecedence_Test_0016c718;
  return;
}

Assistant:

TEST_F(ExprWriterTest, PiecewiseLinearExprPrecedence) {
  auto plterm = BeginPLTerm(2);
  plterm.AddSlope(-1);
  plterm.AddBreakpoint(5);
  plterm.AddSlope(0);
  plterm.AddBreakpoint(10);
  plterm.AddSlope(1);
  CHECK_WRITE("<<5, 10; -1, 0, 1>> x43 ^ 2",
      MakeBinary(ex::POW, EndPLTerm(plterm, MakeVariable(42)), MakeConst(2)));
}